

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

void lws_vhost_bind_wsi(lws_vhost *vh,lws *wsi)

{
  lws_log_cx *cx;
  char *local_50;
  char *local_40;
  lws *wsi_local;
  lws_vhost *vh_local;
  
  if ((wsi->a).vhost != vh) {
    (wsi->a).vhost = vh;
    vh->count_bound_wsi = vh->count_bound_wsi + 1;
    cx = lwsl_wsi_get_cx(wsi);
    if (wsi->role_ops == (lws_role_ops *)0x0) {
      local_40 = "none";
    }
    else {
      local_40 = wsi->role_ops->name;
    }
    if ((wsi->a).protocol == (lws_protocols *)0x0) {
      local_50 = "none";
    }
    else {
      local_50 = ((wsi->a).protocol)->name;
    }
    _lws_log_cx(cx,lws_log_prepend_wsi,wsi,0x10,"lws_vhost_bind_wsi",
                "vh %s: wsi %s/%s, count_bound_wsi %d\n",vh->name,local_40,local_50,
                vh->count_bound_wsi);
    if (((wsi->a).vhost)->count_bound_wsi < 1) {
      __assert_fail("wsi->a.vhost->count_bound_wsi > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core-net/wsi.c"
                    ,0x57,"void lws_vhost_bind_wsi(struct lws_vhost *, struct lws *)");
    }
  }
  return;
}

Assistant:

void
lws_vhost_bind_wsi(struct lws_vhost *vh, struct lws *wsi)
{
	if (wsi->a.vhost == vh)
		return;

	lws_context_lock(vh->context, __func__); /* ---------- context { */
	wsi->a.vhost = vh;

#if defined(LWS_WITH_TLS_JIT_TRUST)
	if (!vh->count_bound_wsi && vh->grace_after_unref) {
		lwsl_wsi_info(wsi, "in use");
		lws_sul_cancel(&vh->sul_unref);
	}
#endif

	vh->count_bound_wsi++;
	lws_context_unlock(vh->context); /* } context ---------- */

	lwsl_wsi_debug(wsi, "vh %s: wsi %s/%s, count_bound_wsi %d\n",
		   vh->name, wsi->role_ops ? wsi->role_ops->name : "none",
		   wsi->a.protocol ? wsi->a.protocol->name : "none",
		   vh->count_bound_wsi);
	assert(wsi->a.vhost->count_bound_wsi > 0);
}